

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

void __thiscall
fmt::internal::PrintfArgFormatter<wchar_t>::visit_custom
          (PrintfArgFormatter<wchar_t> *this,CustomValue c)

{
  wchar_t *format;
  wchar_t format_str [2];
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40 [2];
  undefined4 local_30;
  BasicWriter<wchar_t> *local_28;
  void *local_20;
  undefined8 uStack_18;
  long local_10;
  
  local_28 = (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).
             writer_;
  local_40[0] = 0;
  local_30 = 0;
  local_20 = (void *)0x0;
  uStack_18 = 0;
  local_10 = 0;
  local_50 = &local_48;
  local_48 = 0x7d;
  (*c.format)(local_40,c.value,&local_50);
  if (local_20 != (void *)0x0) {
    operator_delete(local_20,local_10 - (long)local_20);
  }
  return;
}

Assistant:

void visit_custom(Arg::CustomValue c) {
    BasicFormatter<Char> formatter(ArgList(), this->writer());
    const Char format_str[] = {'}', 0};
    const Char *format = format_str;
    c.format(&formatter, c.value, &format);
  }